

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImRect GetResizeBorderRect(ImGuiWindow *window,int border_n,float perp_padding,float thickness)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  ImRect IVar7;
  
  fVar6 = (window->Pos).x;
  fVar2 = (window->Pos).y;
  fVar4 = (window->Size).x + fVar6;
  fVar5 = (window->Size).y + fVar2;
  if ((thickness == 0.0) && (!NAN(thickness))) {
    fVar4 = fVar4 + -1.0;
    fVar5 = fVar5 + -1.0;
  }
  switch(border_n) {
  case 0:
    break;
  case 1:
    fVar1 = fVar4 - thickness;
    fVar3 = fVar2 + perp_padding;
    fVar6 = thickness + fVar4;
    fVar5 = fVar5 - perp_padding;
    goto LAB_00165897;
  case 2:
    fVar2 = fVar5;
    break;
  case 3:
    fVar1 = fVar6 - thickness;
    fVar3 = fVar2 + perp_padding;
    fVar6 = fVar6 + thickness;
    fVar5 = fVar5 - perp_padding;
    goto LAB_00165897;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.cpp"
                  ,0x13a7,"ImRect GetResizeBorderRect(ImGuiWindow *, int, float, float)");
  }
  fVar1 = fVar6 + perp_padding;
  fVar3 = fVar2 - thickness;
  fVar6 = fVar4 - perp_padding;
  fVar5 = fVar2 + thickness;
LAB_00165897:
  IVar7.Max.y = fVar5;
  IVar7.Max.x = fVar6;
  IVar7.Min.y = fVar3;
  IVar7.Min.x = fVar1;
  return IVar7;
}

Assistant:

static ImRect GetResizeBorderRect(ImGuiWindow* window, int border_n, float perp_padding, float thickness)
{
    ImRect rect = window->Rect();
    if (thickness == 0.0f) rect.Max -= ImVec2(1,1);
    if (border_n == 0) return ImRect(rect.Min.x + perp_padding, rect.Min.y - thickness,    rect.Max.x - perp_padding, rect.Min.y + thickness);      // Top
    if (border_n == 1) return ImRect(rect.Max.x - thickness,    rect.Min.y + perp_padding, rect.Max.x + thickness,    rect.Max.y - perp_padding);   // Right
    if (border_n == 2) return ImRect(rect.Min.x + perp_padding, rect.Max.y - thickness,    rect.Max.x - perp_padding, rect.Max.y + thickness);      // Bottom
    if (border_n == 3) return ImRect(rect.Min.x - thickness,    rect.Min.y + perp_padding, rect.Min.x + thickness,    rect.Max.y - perp_padding);   // Left
    IM_ASSERT(0);
    return ImRect();
}